

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_graph.h
# Opt level: O2

WeightedGraph<int,_int> * __thiscall
data_structures::WeightedGraph<int,_int>::addVertex(WeightedGraph<int,_int> *this,int *vertex)

{
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_00;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_> *v
  ;
  WeightedGraphAdjSet<int,_int> WStack_58;
  
  this_00 = &this->_tree;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::add(this_00,vertex);
  v = RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getNode(this_00,vertex);
  WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&WStack_58,v);
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::set(this_00,vertex,&WStack_58);
  WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&WStack_58);
  return this;
}

Assistant:

inline
    WeightedGraph<T, Weight>& WeightedGraph<T, Weight>::addVertex(const T &vertex){
        _tree.add(vertex);
        _tree.set(vertex, WeightedGraphAdjSet<T, Weight>(_tree.getNode(vertex)));
        return *this;
    }